

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()
          (MacOSXContentGeneratorType *this,cmSourceFile *source,char *pkgloc,string *config)

{
  bool bVar1;
  __type _Var2;
  cmGeneratorTarget *this_00;
  pointer pcVar3;
  string *psVar4;
  cmGlobalNinjaGenerator *pcVar5;
  mapped_type *pmVar6;
  string local_178;
  string local_158;
  string local_138;
  cmAlphaNum local_118;
  cmAlphaNum local_e8;
  undefined1 local_b8 [8];
  string output;
  string input;
  undefined1 local_68 [8];
  string nativeMacdir;
  string macdir;
  string *config_local;
  char *pkgloc_local;
  cmSourceFile *source_local;
  MacOSXContentGeneratorType *this_local;
  
  this_00 = GetGeneratorTarget(this->Generator);
  bVar1 = cmGeneratorTarget::IsBundleOnApple(this_00);
  if (!bVar1) {
    return;
  }
  pcVar3 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
           operator->(&this->Generator->OSXBundleGenerator);
  cmOSXBundleGenerator::InitMacOSXContentDirectory
            ((string *)((long)&nativeMacdir.field_2 + 8),pcVar3,pkgloc,config);
  bVar1 = std::operator!=(config,&this->FileConfig);
  if (bVar1) {
    pcVar3 = std::unique_ptr<cmOSXBundleGenerator,_std::default_delete<cmOSXBundleGenerator>_>::
             operator->(&this->Generator->OSXBundleGenerator);
    cmOSXBundleGenerator::InitMacOSXContentDirectory
              ((string *)local_68,pcVar3,pkgloc,&this->FileConfig);
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&nativeMacdir.field_2 + 8),
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68);
    std::__cxx11::string::~string((string *)local_68);
    if (_Var2) goto LAB_006f7c64;
  }
  psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(source);
  std::__cxx11::string::string((string *)(output.field_2._M_local_buf + 8),(string *)psVar4);
  pcVar5 = GetGlobalGenerator(this->Generator);
  psVar4 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar5,(string *)((long)&output.field_2 + 8));
  std::__cxx11::string::operator=((string *)(output.field_2._M_local_buf + 8),(string *)psVar4);
  cmAlphaNum::cmAlphaNum(&local_e8,(string *)((long)&nativeMacdir.field_2 + 8));
  cmAlphaNum::cmAlphaNum(&local_118,'/');
  cmsys::SystemTools::GetFilenameName(&local_138,(string *)((long)&output.field_2 + 8));
  cmStrCat<std::__cxx11::string>((string *)local_b8,&local_e8,&local_118,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  pcVar5 = GetGlobalGenerator(this->Generator);
  psVar4 = cmGlobalNinjaGenerator::ConvertToNinjaPath(pcVar5,(string *)local_b8);
  std::__cxx11::string::operator=((string *)local_b8,(string *)psVar4);
  pcVar5 = GetGlobalGenerator(this->Generator);
  std::__cxx11::string::string((string *)&local_158,(string *)(output.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&local_178,(string *)local_b8);
  cmGlobalNinjaGenerator::WriteMacOSXContentBuild(pcVar5,&local_158,&local_178,&this->FileConfig);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_158);
  pmVar6 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmNinjaTargetGenerator::ByConfig>_>_>
           ::operator[](&this->Generator->Configs,config);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&pmVar6->ExtraFiles,(value_type *)local_b8);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string((string *)(output.field_2._M_local_buf + 8));
LAB_006f7c64:
  std::__cxx11::string::~string((string *)(nativeMacdir.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmNinjaTargetGenerator::MacOSXContentGeneratorType::operator()(
  cmSourceFile const& source, const char* pkgloc, const std::string& config)
{
  // Skip OS X content when not building a Framework or Bundle.
  if (!this->Generator->GetGeneratorTarget()->IsBundleOnApple()) {
    return;
  }

  std::string macdir =
    this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(pkgloc,
                                                                    config);

  // Reject files that collide with files from the Ninja file's native config.
  if (config != this->FileConfig) {
    std::string nativeMacdir =
      this->Generator->OSXBundleGenerator->InitMacOSXContentDirectory(
        pkgloc, this->FileConfig);
    if (macdir == nativeMacdir) {
      return;
    }
  }

  // Get the input file location.
  std::string input = source.GetFullPath();
  input = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(input);

  // Get the output file location.
  std::string output =
    cmStrCat(macdir, '/', cmSystemTools::GetFilenameName(input));
  output = this->Generator->GetGlobalGenerator()->ConvertToNinjaPath(output);

  // Write a build statement to copy the content into the bundle.
  this->Generator->GetGlobalGenerator()->WriteMacOSXContentBuild(
    input, output, this->FileConfig);

  // Add as a dependency to the target so that it gets called.
  this->Generator->Configs[config].ExtraFiles.push_back(std::move(output));
}